

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

void __thiscall
gui::TextBox::TextBox(TextBox *this,shared_ptr<gui::TextBoxStyle> *style,String *name)

{
  Widget *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<gui::TextBoxStyle> *in_stack_ffffffffffffff78;
  shared_ptr<gui::TextBoxStyle> *in_stack_ffffffffffffff80;
  String *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd8;
  TextBox *in_stack_ffffffffffffffe0;
  
  Widget::Widget(in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__TextBox_002f8068;
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x1da125);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x1da13d);
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::Signal
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x1da155);
  Signal<gui::Widget_*,_const_sf::String_&>::Signal
            ((Signal<gui::Widget_*,_const_sf::String_&> *)0x1da16d);
  Signal<gui::Widget_*,_const_sf::String_&>::Signal
            ((Signal<gui::Widget_*,_const_sf::String_&> *)0x1da185);
  std::shared_ptr<gui::TextBoxStyle>::shared_ptr
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(undefined1 *)(in_RDI + 0x61) = 0;
  in_RDI[0x62] = 0;
  in_RDI[99] = 0;
  *(undefined1 *)(in_RDI + 100) = 0;
  sf::Vector2<float>::Vector2((Vector2<float> *)((long)in_RDI + 0x324));
  sf::String::String((String *)0x1da1ef);
  sf::String::String((String *)0x1da207);
  sf::String::String((String *)0x1da21f);
  in_RDI[0x72] = 0;
  sf::Vector2<float>::Vector2((Vector2<float> *)(in_RDI + 0x74));
  updateCaretPosition(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TextBox::TextBox(std::shared_ptr<TextBoxStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    widthCharacters_(0),
    maxCharacters_(0),
    readOnly_(false),
    horizontalScroll_(0) {

    updateCaretPosition(0);
}